

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cc
# Opt level: O0

void tvm::contrib::topk<float,long>
               (DLTensor *input,DLTensor *out_values,DLTensor *out_indices,int k,int axis,
               bool is_ascend)

{
  void *pvVar1;
  iterator iVar2;
  iterator iVar3;
  reference pvVar4;
  pair<long,_float> pVar5;
  long local_130;
  pointer local_108;
  void *local_100;
  size_type local_f8;
  int64_t kk_1;
  int64_t cnt;
  pair<long,_float> local_a8;
  long local_98;
  int64_t full_idx;
  int64_t kk;
  int64_t dst_base_idx;
  int64_t src_base_idx;
  int local_70;
  int j;
  int i_1;
  int i;
  int axis_mul_after;
  int axis_mul_before;
  vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_> sorter;
  long *indices_ptr;
  float *values_ptr;
  float *data_ptr;
  int iStack_24;
  bool is_ascend_local;
  int axis_local;
  int k_local;
  DLTensor *out_indices_local;
  DLTensor *out_values_local;
  DLTensor *input_local;
  
  pvVar1 = input->data;
  if (out_values == (DLTensor *)0x0) {
    local_100 = (void *)0x0;
  }
  else {
    local_100 = out_values->data;
  }
  if (out_indices == (DLTensor *)0x0) {
    local_108 = (pointer)0x0;
  }
  else {
    local_108 = (pointer)out_indices->data;
  }
  sorter.super__Vector_base<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_108;
  std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>::vector
            ((vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_> *)
             &axis_mul_after);
  i = 1;
  i_1 = 1;
  for (j = 0; j < input->ndim; j = j + 1) {
    if (j < axis) {
      i = i * (int)input->shape[j];
    }
    else if (axis < j) {
      i_1 = i_1 * (int)input->shape[j];
    }
  }
  iStack_24 = k;
  if (k < 1) {
    iStack_24 = (int)input->shape[axis];
  }
  for (local_70 = 0; local_70 < i; local_70 = local_70 + 1) {
    for (src_base_idx._4_4_ = 0; src_base_idx._4_4_ < i_1;
        src_base_idx._4_4_ = src_base_idx._4_4_ + 1) {
      std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>::clear
                ((vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_> *)
                 &axis_mul_after);
      dst_base_idx = (long)local_70 * input->shape[axis] * (long)i_1 + (long)src_base_idx._4_4_;
      kk = (int64_t)(local_70 * iStack_24 * i_1 + src_base_idx._4_4_);
      for (full_idx = 0; full_idx < input->shape[axis]; full_idx = full_idx + 1) {
        local_98 = dst_base_idx + full_idx * i_1;
        pVar5 = std::make_pair<long&,float&>(&full_idx,(float *)((long)pvVar1 + local_98 * 4));
        local_a8.first = pVar5.first;
        local_a8.second = pVar5.second;
        std::vector<std::pair<long,float>,std::allocator<std::pair<long,float>>>::
        emplace_back<std::pair<long,float>>
                  ((vector<std::pair<long,float>,std::allocator<std::pair<long,float>>> *)
                   &axis_mul_after,&local_a8);
      }
      if (is_ascend) {
        iVar2 = std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>::begin
                          ((vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>
                            *)&axis_mul_after);
        iVar3 = std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>::end
                          ((vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>
                            *)&axis_mul_after);
        std::
        stable_sort<__gnu_cxx::__normal_iterator<std::pair<long,float>*,std::vector<std::pair<long,float>,std::allocator<std::pair<long,float>>>>,bool(*)(std::pair<long,float>const&,std::pair<long,float>const&)>
                  ((__normal_iterator<std::pair<long,_float>_*,_std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>_>
                    )iVar2._M_current,
                   (__normal_iterator<std::pair<long,_float>_*,_std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>_>
                    )iVar3._M_current,CompareAscend<float>);
      }
      else {
        iVar2 = std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>::begin
                          ((vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>
                            *)&axis_mul_after);
        iVar3 = std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>::end
                          ((vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>
                            *)&axis_mul_after);
        std::
        stable_sort<__gnu_cxx::__normal_iterator<std::pair<long,float>*,std::vector<std::pair<long,float>,std::allocator<std::pair<long,float>>>>,bool(*)(std::pair<long,float>const&,std::pair<long,float>const&)>
                  ((__normal_iterator<std::pair<long,_float>_*,_std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>_>
                    )iVar2._M_current,
                   (__normal_iterator<std::pair<long,_float>_*,_std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>_>
                    )iVar3._M_current,CompareDescend<float>);
      }
      if (iStack_24 < 1) {
        local_130 = input->shape[axis];
      }
      else {
        local_130 = (long)iStack_24;
      }
      for (local_f8 = 0; (long)local_f8 < local_130; local_f8 = local_f8 + 1) {
        if (sorter.
            super__Vector_base<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          pvVar4 = std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>::
                   operator[]((vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>
                               *)&axis_mul_after,local_f8);
          (&(sorter.
             super__Vector_base<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage)->first)[kk + local_f8 * (long)i_1] =
               pvVar4->first;
        }
        if (local_100 != (void *)0x0) {
          pvVar4 = std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>::
                   operator[]((vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>
                               *)&axis_mul_after,local_f8);
          *(float *)((long)local_100 + (kk + local_f8 * (long)i_1) * 4) = pvVar4->second;
        }
      }
    }
  }
  std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>::~vector
            ((vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_> *)
             &axis_mul_after);
  return;
}

Assistant:

void topk(DLTensor* input,
          DLTensor* out_values,
          DLTensor* out_indices,
          int k,
          int axis,
          bool is_ascend) {
  DataType* data_ptr = static_cast<DataType *>(input->data);
  DataType* values_ptr = (out_values == nullptr) ? nullptr :
          static_cast<DataType *>(out_values->data);
  IndicesType* indices_ptr = (out_indices == nullptr) ? nullptr :
          static_cast<IndicesType *>(out_indices->data);
  std::vector<std::pair<int64_t, DataType> > sorter;

  int axis_mul_before = 1;
  int axis_mul_after = 1;
  for (int i = 0; i < input->ndim; ++i) {
    if (i < axis) {
      axis_mul_before *= input->shape[i];
    } else if (i > axis) {
      axis_mul_after *= input->shape[i];
    }
  }
  if (k < 1) {
    k = input->shape[axis];
  }

  for (int i = 0 ; i < axis_mul_before; ++i) {
    for (int j = 0 ; j < axis_mul_after; ++j) {
      sorter.clear();
      int64_t src_base_idx = i * input->shape[axis] * axis_mul_after + j;
      int64_t dst_base_idx = i * k * axis_mul_after + j;
      for (int64_t kk = 0; kk < input->shape[axis]; ++kk) {
        int64_t full_idx = src_base_idx + kk * axis_mul_after;
        sorter.emplace_back(std::make_pair(kk, data_ptr[full_idx]));
      }
      if (is_ascend) {
        std::stable_sort(sorter.begin(), sorter.end(), CompareAscend<DataType>);
      } else {
        std::stable_sort(sorter.begin(), sorter.end(), CompareDescend<DataType>);
      }
      int64_t cnt = k > 0 ? k : input->shape[axis];
      for (int64_t kk = 0; kk < cnt; ++kk) {
        if (indices_ptr != nullptr) {
          indices_ptr[dst_base_idx + kk * axis_mul_after] =
                  static_cast<IndicesType>(sorter[kk].first);
        }
        if (values_ptr != nullptr) {
          values_ptr[dst_base_idx + kk * axis_mul_after] =
                  static_cast<DataType>(sorter[kk].second);
        }
      }
    }
  }
}